

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_child.c
# Opt level: O0

int provider_create_child_cb(OSSL_CORE_HANDLE *prov,void *cbdata)

{
  int iVar1;
  void *pvVar2;
  OSSL_PROVIDER *pOVar3;
  OSSL_CORE_HANDLE *in_RDI;
  int unaff_retaddr;
  OSSL_provider_init_fn *in_stack_00000008;
  int ret;
  OSSL_PROVIDER *cprov;
  char *provname;
  child_prov_globals *gbl;
  OSSL_LIB_CTX *ctx;
  int in_stack_000000ac;
  OSSL_PROVIDER **in_stack_000000b0;
  OSSL_LIB_CTX *in_stack_000000b8;
  CRYPTO_RWLOCK *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int upcalls;
  OSSL_LIB_CTX_METHOD *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  OSSL_LIB_CTX *in_stack_ffffffffffffffd8;
  
  upcalls = 0;
  pvVar2 = ossl_lib_ctx_get_data
                     (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                      in_stack_ffffffffffffffc8);
  if (pvVar2 == (void *)0x0) {
    return 0;
  }
  iVar1 = CRYPTO_THREAD_write_lock(in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    return 0;
  }
  (**(code **)((long)pvVar2 + 0x30))(in_RDI);
  *(OSSL_CORE_HANDLE **)((long)pvVar2 + 8) = in_RDI;
  pOVar3 = ossl_provider_find(in_stack_000000b8,(char *)in_stack_000000b0,in_stack_000000ac);
  if (pOVar3 == (OSSL_PROVIDER *)0x0) {
    pOVar3 = ossl_provider_new((OSSL_LIB_CTX *)provname,(char *)cprov,in_stack_00000008,
                               unaff_retaddr);
    if ((pOVar3 == (OSSL_PROVIDER *)0x0) ||
       (iVar1 = ossl_provider_activate(pOVar3,upcalls,in_stack_ffffffffffffffc0), iVar1 == 0))
    goto LAB_00291304;
    iVar1 = ossl_provider_set_child(pOVar3,in_RDI);
    if ((iVar1 == 0) ||
       (iVar1 = ossl_provider_add_to_store
                          ((OSSL_PROVIDER *)in_stack_000000b8,in_stack_000000b0,in_stack_000000ac),
       iVar1 == 0)) {
      ossl_provider_deactivate(pOVar3,upcalls);
      ossl_provider_free((OSSL_PROVIDER *)CONCAT44(upcalls,in_stack_ffffffffffffffc0));
      goto LAB_00291304;
    }
  }
  else {
    ossl_provider_free((OSSL_PROVIDER *)CONCAT44(upcalls,in_stack_ffffffffffffffc0));
    iVar1 = ossl_provider_activate(pOVar3,upcalls,in_stack_ffffffffffffffc0);
    if (iVar1 == 0) goto LAB_00291304;
  }
  upcalls = 1;
LAB_00291304:
  CRYPTO_THREAD_unlock(in_stack_ffffffffffffffb8);
  return upcalls;
}

Assistant:

static int provider_create_child_cb(const OSSL_CORE_HANDLE *prov, void *cbdata)
{
    OSSL_LIB_CTX *ctx = cbdata;
    struct child_prov_globals *gbl;
    const char *provname;
    OSSL_PROVIDER *cprov;
    int ret = 0;

    gbl = ossl_lib_ctx_get_data(ctx, OSSL_LIB_CTX_CHILD_PROVIDER_INDEX,
                                &child_prov_ossl_ctx_method);
    if (gbl == NULL)
        return 0;

    if (!CRYPTO_THREAD_write_lock(gbl->lock))
        return 0;

    provname = gbl->c_prov_name(prov);

    /*
     * We're operating under a lock so we can store the "current" provider in
     * the global data.
     */
    gbl->curr_prov = prov;

    if ((cprov = ossl_provider_find(ctx, provname, 1)) != NULL) {
        /*
         * We free the newly created ref. We rely on the provider sticking around
         * in the provider store.
         */
        ossl_provider_free(cprov);

        /*
         * The provider already exists. It could be a previously created child,
         * or it could have been explicitly loaded. If explicitly loaded we
         * ignore it - i.e. we don't start treating it like a child.
         */
        if (!ossl_provider_activate(cprov, 0, 1))
            goto err;
    } else {
        /*
         * Create it - passing 1 as final param so we don't try and recursively
         * init children
         */
        if ((cprov = ossl_provider_new(ctx, provname, ossl_child_provider_init,
                                       1)) == NULL)
            goto err;

        if (!ossl_provider_activate(cprov, 0, 0))
            goto err;

        if (!ossl_provider_set_child(cprov, prov)
            || !ossl_provider_add_to_store(cprov, NULL, 0)) {
            ossl_provider_deactivate(cprov, 0);
            ossl_provider_free(cprov);
            goto err;
        }
    }

    ret = 1;
 err:
    CRYPTO_THREAD_unlock(gbl->lock);
    return ret;
}